

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URL.cpp
# Opt level: O1

void __thiscall URL::URL(URL *this,string *url)

{
  string *this_00;
  string *this_01;
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 *local_e0;
  size_t local_d8;
  undefined1 local_d0 [16];
  string *local_c0;
  string *local_b8;
  string *local_b0;
  string *local_a8;
  string *local_a0;
  string *local_98;
  string *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  string *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->_url).field_2;
  (this->_url)._M_dataplus._M_p = (pointer)local_38;
  (this->_url)._M_string_length = 0;
  (this->_url).field_2._M_local_buf[0] = '\0';
  this_00 = &this->_host;
  local_40 = &(this->_host).field_2;
  (this->_host)._M_dataplus._M_p = (pointer)local_40;
  (this->_host)._M_string_length = 0;
  (this->_host).field_2._M_local_buf[0] = '\0';
  this_01 = &this->_protocoll;
  local_50 = &(this->_protocoll).field_2;
  (this->_protocoll)._M_dataplus._M_p = (pointer)local_50;
  (this->_protocoll)._M_string_length = 0;
  (this->_protocoll).field_2._M_local_buf[0] = '\0';
  local_c0 = (string *)&this->_portNumber;
  local_58 = &(this->_portNumber).field_2;
  (this->_portNumber)._M_dataplus._M_p = (pointer)local_58;
  (this->_portNumber)._M_string_length = 0;
  (this->_portNumber).field_2._M_local_buf[0] = '\0';
  local_90 = (string *)&this->_relativePath;
  local_60 = &(this->_relativePath).field_2;
  (this->_relativePath)._M_dataplus._M_p = (pointer)local_60;
  (this->_relativePath)._M_string_length = 0;
  (this->_relativePath).field_2._M_local_buf[0] = '\0';
  local_a0 = (string *)&this->_queryString;
  local_68 = &(this->_queryString).field_2;
  (this->_queryString)._M_dataplus._M_p = (pointer)local_68;
  (this->_queryString)._M_string_length = 0;
  (this->_queryString).field_2._M_local_buf[0] = '\0';
  local_98 = &this->SECUREPROTOCOLPORT;
  local_70 = &(this->SECUREPROTOCOLPORT).field_2;
  (this->SECUREPROTOCOLPORT)._M_dataplus._M_p = (pointer)local_70;
  local_48 = this_01;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"443","");
  local_a8 = &this->REGULAREPROTOCOLPORT;
  local_78 = &(this->REGULAREPROTOCOLPORT).field_2;
  (this->REGULAREPROTOCOLPORT)._M_dataplus._M_p = (pointer)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"80","");
  local_b0 = &this->REGULARPROTOCOL;
  local_80 = &(this->REGULARPROTOCOL).field_2;
  (this->REGULARPROTOCOL)._M_dataplus._M_p = (pointer)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"http","");
  local_b8 = &this->SECUREPROTOCOL;
  local_88 = &(this->SECUREPROTOCOL).field_2;
  (this->SECUREPROTOCOL)._M_dataplus._M_p = (pointer)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"https","");
  std::__cxx11::string::_M_assign((string *)this);
  iVar2 = std::__cxx11::string::find((char *)url,0x108381,0);
  if (iVar2 == -1) {
    std::__cxx11::string::_M_assign((string *)this_01);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)url);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_e0);
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
    }
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)url);
    std::__cxx11::string::operator=((string *)url,(string *)&local_e0);
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
    }
  }
  iVar2 = std::__cxx11::string::find((char *)url,0x108383,0);
  iVar3 = std::__cxx11::string::find((char *)url,0x108385,0);
  iVar4 = std::__cxx11::string::find((char *)url,0x108387,0);
  if (iVar3 == -1) {
    pcVar1 = (this->_protocoll)._M_dataplus._M_p;
    local_e0 = local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar1,pcVar1 + (this->_protocoll)._M_string_length);
    if ((local_d8 == (this->SECUREPROTOCOL)._M_string_length) && (local_d8 != 0)) {
      bcmp(local_e0,(local_b8->_M_dataplus)._M_p,local_d8);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
    }
    std::__cxx11::string::_M_assign(local_c0);
  }
  else {
    if (iVar2 == -1) {
      iVar2 = (int)url->_M_string_length;
    }
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)url);
    std::__cxx11::string::operator=(local_c0,(string *)&local_e0);
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
    }
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)url);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)this_00);
  if (iVar3 == 0) {
    if (iVar2 == -1) {
      std::__cxx11::string::_M_assign((string *)this_00);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_e0,(ulong)url);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
      if (local_e0 != local_d0) {
        operator_delete(local_e0);
      }
    }
  }
  if (iVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)url);
    std::__cxx11::string::operator=(local_90,(string *)&local_e0);
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
    }
  }
  if (iVar4 != -1) {
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)url);
    std::__cxx11::string::operator=(local_a0,(string *)&local_e0);
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
    }
  }
  return;
}

Assistant:

URL::URL(std::string url) {
  _url = url;
  // Get the protocoll end pos
  int protocollPos = url.find("://");

  if (protocollPos == std::string::npos) {
    _protocoll = REGULARPROTOCOL;
    protocollPos = 0;
  } else {
    _protocoll = url.substr(0, protocollPos);
    // Remove the protocoll part from the url
    url = url.substr(protocollPos+3, url.size());
  }

  /* Find the hostname ended by / or by : depending on if
  port is specified or not */

  int hostNameEndPos = url.find("/");
  int portEndPos = url.find(":");

  int queryStringStartPos = url.find("?");

  // If the port position do not exists, set default to 80
  if (portEndPos == std::string::npos) {
    if (this->GetProtocoll() == SECUREPROTOCOL) {
      _portNumber = SECUREPROTOCOLPORT;
    } else {
      _portNumber = REGULAREPROTOCOLPORT;
    }
  } else {
    /* If there is nothing more than the hostname e.g. www.google.com,
    get the last position
    */
    if (hostNameEndPos == string::npos) {
      hostNameEndPos = url.size();
    }
    // If there is a port specified, e.g. www.google.com:80/subfolder
    _portNumber = url.substr(portEndPos+1, hostNameEndPos-(portEndPos+1));
    _host = url.substr(0, portEndPos);
  }

  // If the host was not set by due to that the port was not specified
  if (_host == "") {
    if (hostNameEndPos == string::npos) {
      _host = url;
    } else {
      _host = url.substr(0, hostNameEndPos);
    }
  }

  // Set the relative part of the URL
  if (hostNameEndPos != string::npos) {
    _relativePath = url.substr(hostNameEndPos, url.size()-hostNameEndPos);
  }

  // Set the query string part of the URL
  if (queryStringStartPos != string::npos) {
      _queryString = url.substr(queryStringStartPos,
                                url.size()-queryStringStartPos);
    }
}